

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O3

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeMaxObj(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *newVal,bool scale)

{
  SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar1;
  pointer pnVar2;
  int32_t iVar3;
  undefined7 in_register_00000009;
  long lVar4;
  undefined4 *puVar5;
  uint *puVar6;
  pointer pnVar7;
  uint *puVar8;
  byte bVar9;
  uint auStack_118 [28];
  int local_a8;
  undefined1 local_a4;
  undefined8 local_a0;
  undefined4 local_98 [28];
  int local_28;
  bool local_24;
  undefined8 local_20;
  
  bVar9 = 0;
  if ((int)CONCAT71(in_register_00000009,scale) == 0) {
    pnVar2 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (uint *)newVal;
    puVar8 = (uint *)(pnVar2 + i);
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar8 = *puVar6;
      puVar6 = puVar6 + 1;
      puVar8 = puVar8 + 1;
    }
    pnVar2[i].m_backend.exp = (newVal->m_backend).exp;
    pnVar2[i].m_backend.neg = (newVal->m_backend).neg;
    iVar3 = (newVal->m_backend).prec_elem;
    pnVar2[i].m_backend.fpclass = (newVal->m_backend).fpclass;
    pnVar2[i].m_backend.prec_elem = iVar3;
  }
  else {
    pSVar1 = this->lp_scaler;
    puVar6 = (uint *)newVal;
    puVar8 = auStack_118;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar8 = *puVar6;
      puVar6 = puVar6 + 1;
      puVar8 = puVar8 + 1;
    }
    local_a8 = (newVal->m_backend).exp;
    local_a4 = (newVal->m_backend).neg;
    local_a0._0_4_ = (newVal->m_backend).fpclass;
    local_a0._4_4_ = (newVal->m_backend).prec_elem;
    (*pSVar1->_vptr_SPxScaler[0x29])(local_98,pSVar1,this,i);
    pnVar2 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar5 = local_98;
    pnVar7 = pnVar2 + i;
    for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
      (pnVar7->m_backend).data._M_elems[0] = *puVar5;
      puVar5 = puVar5 + (ulong)bVar9 * -2 + 1;
      pnVar7 = (pointer)((long)pnVar7 + ((ulong)bVar9 * -2 + 1) * 4);
    }
    pnVar2[i].m_backend.exp = local_28;
    pnVar2[i].m_backend.neg = local_24;
    pnVar2[i].m_backend.fpclass = (undefined4)local_20;
    pnVar2[i].m_backend.prec_elem = local_20._4_4_;
  }
  return;
}

Assistant:

virtual void changeMaxObj(int i, const R& newVal, bool scale = false)
   {
      if(scale)
      {
         assert(_isScaled);
         assert(lp_scaler);
         LPColSetBase<R>::maxObj_w(i) = lp_scaler->scaleObj(*this, i, newVal);
      }
      else
         LPColSetBase<R>::maxObj_w(i) = newVal;

      assert(isConsistent());
   }